

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O0

int arkStepCompatibleWithAdjointSolver
              (ARKodeMem ark_mem,ARKodeARKStepMem step_mem,int lineno,char *fname,char *filename)

{
  char *in_RCX;
  uint in_EDX;
  long *in_RSI;
  ARKodeMem in_RDI;
  char *in_R8;
  int local_4;
  
  if (in_RDI->fixedstep == 0) {
    arkProcessError(in_RDI,-0x16,(int)(ulong)in_EDX,in_RCX,in_R8,
                    "ARKStep must be using a fixed step to work with SUNAdjointStepper");
    local_4 = -0x16;
  }
  else if (in_RSI[1] == 0) {
    if (*in_RSI == 0) {
      arkProcessError(in_RDI,-0x16,(int)(ulong)in_EDX,in_RCX,in_R8,
                      "SUNAdjointStepper requires fe != NULL (it only supports explicit RK methods)"
                     );
      local_4 = -0x16;
    }
    else if (in_RDI->relax_enabled == 0) {
      if ((int)in_RSI[0x30] == 0) {
        if (in_RDI->constraintsSet == 0) {
          local_4 = 0;
        }
        else {
          arkProcessError(in_RDI,-0x16,(int)(ulong)in_EDX,in_RCX,in_R8,
                          "SUNAdjointStepper is not compatible with constraints");
          local_4 = -0x16;
        }
      }
      else {
        arkProcessError(in_RDI,-0x16,(int)(ulong)in_EDX,in_RCX,in_R8,
                        "SUNAdjointStepper is not compatible with non-identity mass matrices");
        local_4 = -0x16;
      }
    }
    else {
      arkProcessError(in_RDI,-0x16,(int)(ulong)in_EDX,in_RCX,in_R8,
                      "SUNAdjointStepper is not compatible with relaxation");
      local_4 = -0x16;
    }
  }
  else {
    arkProcessError(in_RDI,-0x16,(int)(ulong)in_EDX,in_RCX,in_R8,
                    "SUNAdjointStepper requires fi = NULL (it only supports explicit RK methods)");
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

int arkStepCompatibleWithAdjointSolver(ARKodeMem ark_mem,
                                       ARKodeARKStepMem step_mem, int lineno,
                                       const char* fname, const char* filename)
{
  if (!ark_mem->fixedstep)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, lineno, fname,
                    filename, "ARKStep must be using a fixed step to work with SUNAdjointStepper");
    return ARK_ILL_INPUT;
  }

  if (step_mem->fi)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, lineno, fname,
                    filename, "SUNAdjointStepper requires fi = NULL (it only supports explicit RK methods)");
    return ARK_ILL_INPUT;
  }

  if (!step_mem->fe)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, lineno, fname,
                    filename, "SUNAdjointStepper requires fe != NULL (it only supports explicit RK methods)");
    return ARK_ILL_INPUT;
  }

  if (ark_mem->relax_enabled)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, lineno, fname, filename,
                    "SUNAdjointStepper is not compatible with relaxation");
    return ARK_ILL_INPUT;
  }

  if (step_mem->mass_type != MASS_IDENTITY)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, lineno, fname,
                    filename, "SUNAdjointStepper is not compatible with non-identity mass matrices");
    return ARK_ILL_INPUT;
  }

  if (ark_mem->constraintsSet)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, lineno, fname, filename,
                    "SUNAdjointStepper is not compatible with constraints");
    return ARK_ILL_INPUT;
  }

  return ARK_SUCCESS;
}